

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void dma_synchronize(Emulator *e)

{
  if ((e->state).dma.state == DMA_INACTIVE) {
    return;
  }
  dma_synchronize_cold_1();
  return;
}

Assistant:

static void dma_synchronize(Emulator* e) {
  if (UNLIKELY(DMA.state != DMA_INACTIVE)) {
    if (TICKS > DMA.sync_ticks) {
      Ticks delta_ticks = TICKS - DMA.sync_ticks;
      DMA.sync_ticks = TICKS;

      Ticks cpu_tick = e->state.cpu_tick;
      for (; delta_ticks > 0; delta_ticks -= cpu_tick) {
        if (DMA.tick_count < DMA_DELAY_TICKS) {
          DMA.tick_count += CPU_TICK;
          if (DMA.tick_count >= DMA_DELAY_TICKS) {
            DMA.tick_count = DMA_DELAY_TICKS;
            DMA.state = DMA_ACTIVE;
          }
          continue;
        }

        u8 addr_offset = (DMA.tick_count - DMA_DELAY_TICKS) >> 2;
        assert(addr_offset < OAM_TRANSFER_SIZE);
        u8 value =
            read_u8_pair(e, map_address(DMA.source + addr_offset), FALSE);
        write_oam_no_mode_check(e, addr_offset, value);
        DMA.tick_count += CPU_TICK;
        if (VALUE_WRAPPED(DMA.tick_count, DMA_TICKS)) {
          DMA.state = DMA_INACTIVE;
          break;
        }
      }
    }
  }
}